

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BXNS(DisasContext_conflict1 *s,arg_BXNS *a)

{
  arg_BXNS *a_local;
  DisasContext_conflict1 *s_local;
  
  if ((s->v8m_secure & 1U) == 0) {
    unallocated_encoding_aarch64(s);
  }
  else {
    gen_bxns(s,a->rm);
  }
  return true;
}

Assistant:

static bool trans_BXNS(DisasContext *s, arg_BXNS *a)
{
    if (!s->v8m_secure || IS_USER_ONLY) {
        unallocated_encoding(s);
    } else {
        gen_bxns(s, a->rm);
    }
    return true;
}